

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba_test.cpp
# Opt level: O2

void __thiscall JiebaTest_WordTest_Test::TestBody(JiebaTest_WordTest_Test *this)

{
  MixSegment *this_00;
  string *actual;
  char *pcVar1;
  AssertionResult gtest_ar;
  string local_770;
  string local_750;
  allocator<char> local_72d;
  allocator<char> local_72c;
  allocator<char> local_72b;
  allocator<char> local_72a;
  allocator<char> local_729;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> words;
  string result;
  Jieba jieba;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"../dict/jieba.dict.utf8",&local_729);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"../dict/hmm_model.utf8",&local_72a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&words,"../dict/user.dict.utf8",&local_72b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"../dict/idf.utf8",&local_72c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"../dict/stop_words.utf8",&local_72d);
  cppjieba::Jieba::Jieba(&jieba,&result,(string *)&gtest_ar,(string *)&words,&local_770,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&words);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&result);
  words.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  words.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,anon_var_dwarf_87754,(allocator<char> *)&local_770);
  this_00 = &jieba.mix_seg_;
  cppjieba::MixSegment::Cut(this_00,(string *)&gtest_ar,&words,true);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::operator<<(&result,&words);
  testing::internal::CmpHelperEQ<char[196],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"[{\\\"word\\\": \\\"\\xE4\\xBB\\x96\\\", \\\"offset\\\": 0}, {\\\"word\\\": \\\"\\xE6\\x9D\\xA5\\xE5\\x88\\xB0\\\", \\\"offset\\\": 3}, {\\\"word\\\": \\\"\\xE4\\xBA\\x86\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE7\\xBD\\x91\\xE6\\x98\\x93\\\", \\\"offset\\\": 12}, {\\\"word\\\": \\\"\\xE6\\x9D\\xAD\\xE7\\xA0\\x94\\\", \\\"offset\\\": 18}, {\\\"word\\\": \\\"\\xE5\\xA4\\xA7\\xE5\\x8E\\xA6\\\", \\\"offset\\\": 24}]\""
             ,"result",&anon_var_dwarf_fec8b,&result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_770);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_750,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/jieba_test.cpp"
               ,0x36,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_750,(Message *)&local_770);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,anon_var_dwarf_87cda,(allocator<char> *)&local_770);
    cppjieba::MixSegment::Cut(this_00,(string *)&gtest_ar,&words,false);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::operator<<(&result,&words);
    testing::internal::CmpHelperEQ<char[140],std::__cxx11::string>
              ((internal *)&gtest_ar,
               "\"[{\\\"word\\\": \\\"\\xE6\\x88\\x91\\\", \\\"offset\\\": 0}, {\\\"word\\\": \\\"\\xE6\\x9D\\xA5\\xE8\\x87\\xAA\\\", \\\"offset\\\": 3}, {\\\"word\\\": \\\"\\xE5\\x8C\\x97\\xE4\\xBA\\xAC\\xE9\\x82\\xAE\\xE7\\x94\\xB5\\xE5\\xA4\\xA7\\xE5\\xAD\\xA6\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE3\\x80\\x82\\\", \\\"offset\\\": 27}]\""
               ,"result",&anon_var_dwarf_fecbe,&result);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_770);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_750,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/jieba_test.cpp"
                 ,0x3b,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_750,(Message *)&local_770);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,anon_var_dwarf_87d54,(allocator<char> *)&local_770);
      cppjieba::MPSegment::Cut(&jieba.mp_seg_,(string *)&gtest_ar,&words,3);
      std::__cxx11::string::~string((string *)&gtest_ar);
      actual = std::operator<<(&result,&words);
      testing::internal::CmpHelperEQ<char[104],std::__cxx11::string>
                ((internal *)&gtest_ar,
                 "\"[{\\\"word\\\": \\\"\\xE5\\x8D\\x97\\xE4\\xBA\\xAC\\xE5\\xB8\\x82\\\", \\\"offset\\\": 0}, {\\\"word\\\": \\\"\\xE9\\x95\\xBF\\xE6\\xB1\\x9F\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE5\\xA4\\xA7\\xE6\\xA1\\xA5\\\", \\\"offset\\\": 15}]\""
                 ,"result << words",&anon_var_dwarf_fecf0,actual);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_770);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_750,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/jieba_test.cpp"
                   ,0x3f,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_750,(Message *)&local_770)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gtest_ar,anon_var_dwarf_87eda,(allocator<char> *)&local_770);
        cppjieba::HMMSegment::Cut(&jieba.hmm_seg_,(string *)&gtest_ar,&words);
        std::__cxx11::string::~string((string *)&gtest_ar);
        std::operator<<(&result,&words);
        testing::internal::CmpHelperEQ<char[271],std::__cxx11::string>
                  ((internal *)&gtest_ar,
                   "\"[{\\\"word\\\": \\\"\\xE6\\x88\\x91\\xE6\\x9D\\xA5\\\", \\\"offset\\\": 0}, {\\\"word\\\": \\\"\\xE8\\x87\\xAA\\xE5\\x8C\\x97\\xE4\\xBA\\xAC\\\", \\\"offset\\\": 6}, {\\\"word\\\": \\\"\\xE9\\x82\\xAE\\xE7\\x94\\xB5\\xE5\\xA4\\xA7\\xE5\\xAD\\xA6\\\", \\\"offset\\\": 15}, {\\\"word\\\": \\\"\\xE3\\x80\\x82\\\", \\\"offset\\\": 27}, {\\\"word\\\": \\\"\\xE3\\x80\\x82\\\", \\\"offset\\\": 30}, {\\\"word\\\": \\\"\\xE3\\x80\\x82\\\", \\\"offset\\\": 33}, {\\\"word\\\": \\\"\\xE5\\xAD\\xA6\\xE5\\x8F\\xB7\\\", \\\"offset\\\": 36}, {\\\"word\\\": \\\"123456\\\", \\\"offset\\\": 42}]\""
                   ,"result",&anon_var_dwarf_fed23,&result);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_770);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_750,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/jieba_test.cpp"
                     ,0x43,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_750,(Message *)&local_770);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gtest_ar,anon_var_dwarf_8768c,(allocator<char> *)&local_770);
          cppjieba::MixSegment::Cut(this_00,(string *)&gtest_ar,&words,true);
          std::__cxx11::string::~string((string *)&gtest_ar);
          std::operator<<(&result,&words);
          testing::internal::CmpHelperEQ<char[364],std::__cxx11::string>
                    ((internal *)&gtest_ar,
                     "\"[{\\\"word\\\": \\\"\\xE6\\x88\\x91\\\", \\\"offset\\\": 0}, {\\\"word\\\": \\\"\\xE6\\x9D\\xA5\\xE8\\x87\\xAA\\\", \\\"offset\\\": 3}, {\\\"word\\\": \\\"\\xE5\\x8C\\x97\\xE4\\xBA\\xAC\\xE9\\x82\\xAE\\xE7\\x94\\xB5\\xE5\\xA4\\xA7\\xE5\\xAD\\xA6\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE3\\x80\\x82\\\", \\\"offset\\\": 27}, {\\\"word\\\": \\\"\\xE3\\x80\\x82\\\", \\\"offset\\\": 30}, {\\\"word\\\": \\\"\\xE3\\x80\\x82\\\", \\\"offset\\\": 33}, {\\\"word\\\": \\\"\\xE5\\xAD\\xA6\\xE5\\x8F\\xB7\\\", \\\"offset\\\": 36}, {\\\"word\\\": \\\"123456\\\", \\\"offset\\\": 42}, {\\\"word\\\": \\\"\\xEF\\xBC\\x8C\\\", \\\"offset\\\": 48}, {\\\"word\\\": \\\"\\xE7\\x94\\xA8\\\", \\\"offset\\\": 51}, {\\\"word\\\": \\\"AK47\\\", \\\"offset\\\": 54}]\""
                     ,"result",&anon_var_dwarf_fed57,&result);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_770);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_750,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/jieba_test.cpp"
                       ,0x48,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_750,(Message *)&local_770);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gtest_ar,anon_var_dwarf_88025,(allocator<char> *)&local_770);
            cppjieba::FullSegment::Cut(&jieba.full_seg_,(string *)&gtest_ar,&words);
            std::__cxx11::string::~string((string *)&gtest_ar);
            std::operator<<(&result,&words);
            testing::internal::CmpHelperEQ<char[323],std::__cxx11::string>
                      ((internal *)&gtest_ar,
                       "\"[{\\\"word\\\": \\\"\\xE6\\x88\\x91\\\", \\\"offset\\\": 0}, {\\\"word\\\": \\\"\\xE6\\x9D\\xA5\\xE8\\x87\\xAA\\\", \\\"offset\\\": 3}, {\\\"word\\\": \\\"\\xE5\\x8C\\x97\\xE4\\xBA\\xAC\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE5\\x8C\\x97\\xE4\\xBA\\xAC\\xE9\\x82\\xAE\\xE7\\x94\\xB5\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE5\\x8C\\x97\\xE4\\xBA\\xAC\\xE9\\x82\\xAE\\xE7\\x94\\xB5\\xE5\\xA4\\xA7\\xE5\\xAD\\xA6\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE9\\x82\\xAE\\xE7\\x94\\xB5\\\", \\\"offset\\\": 15}, {\\\"word\\\": \\\"\\xE9\\x82\\xAE\\xE7\\x94\\xB5\\xE5\\xA4\\xA7\\xE5\\xAD\\xA6\\\", \\\"offset\\\": 15}, {\\\"word\\\": \\\"\\xE7\\x94\\xB5\\xE5\\xA4\\xA7\\\", \\\"offset\\\": 18}, {\\\"word\\\": \\\"\\xE5\\xA4\\xA7\\xE5\\xAD\\xA6\\\", \\\"offset\\\": 21}]\""
                       ,"result",&anon_var_dwarf_fed8b,&result);
            if (gtest_ar.success_ != false) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&gtest_ar,anon_var_dwarf_87754,(allocator<char> *)&local_770);
              cppjieba::QuerySegment::Cut(&jieba.query_seg_,(string *)&gtest_ar,&words,true);
              std::__cxx11::string::~string((string *)&gtest_ar);
              std::operator<<(&result,&words);
              testing::internal::CmpHelperEQ<char[196],std::__cxx11::string>
                        ((internal *)&gtest_ar,
                         "\"[{\\\"word\\\": \\\"\\xE4\\xBB\\x96\\\", \\\"offset\\\": 0}, {\\\"word\\\": \\\"\\xE6\\x9D\\xA5\\xE5\\x88\\xB0\\\", \\\"offset\\\": 3}, {\\\"word\\\": \\\"\\xE4\\xBA\\x86\\\", \\\"offset\\\": 9}, {\\\"word\\\": \\\"\\xE7\\xBD\\x91\\xE6\\x98\\x93\\\", \\\"offset\\\": 12}, {\\\"word\\\": \\\"\\xE6\\x9D\\xAD\\xE7\\xA0\\x94\\\", \\\"offset\\\": 18}, {\\\"word\\\": \\\"\\xE5\\xA4\\xA7\\xE5\\x8E\\xA6\\\", \\\"offset\\\": 24}]\""
                         ,"result",&anon_var_dwarf_fec8b,&result);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_770);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_750,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/jieba_test.cpp"
                           ,0x52,pcVar1);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_750,(Message *)&local_770);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_750);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_770);
              }
              goto LAB_0015ac99;
            }
            testing::Message::Message((Message *)&local_770);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_750,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/jieba_test.cpp"
                       ,0x4d,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_750,(Message *)&local_770);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_750);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_770);
LAB_0015ac99:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&result);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector(&words);
  cppjieba::Jieba::~Jieba(&jieba);
  return;
}

Assistant:

TEST(JiebaTest, WordTest) {
  cppjieba::Jieba jieba("../dict/jieba.dict.utf8",
                        "../dict/hmm_model.utf8",
                        "../dict/user.dict.utf8",
                        "../dict/idf.utf8",
                        "../dict/stop_words.utf8");
  vector<Word> words;
  string result;

  jieba.Cut("他来到了网易杭研大厦", words);
  result << words;
  ASSERT_EQ("[{\"word\": \"\xE4\xBB\x96\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE5\x88\xB0\", \"offset\": 3}, {\"word\": \"\xE4\xBA\x86\", \"offset\": 9}, {\"word\": \"\xE7\xBD\x91\xE6\x98\x93\", \"offset\": 12}, {\"word\": \"\xE6\x9D\xAD\xE7\xA0\x94\", \"offset\": 18}, {\"word\": \"\xE5\xA4\xA7\xE5\x8E\xA6\", \"offset\": 24}]", result);

  jieba.Cut("我来自北京邮电大学。", words, false);
  result << words;
  //ASSERT_EQ("[\"我\", \"来自\", \"北京邮电大学\", \"。\"]", result);
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE8\x87\xAA\", \"offset\": 3}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 9}, {\"word\": \"\xE3\x80\x82\", \"offset\": 27}]", result);

  jieba.CutSmall("南京市长江大桥", words, 3);
  //ASSERT_EQ("[\"南京市\", \"长江\", \"大桥\"]", result << words);
  ASSERT_EQ("[{\"word\": \"\xE5\x8D\x97\xE4\xBA\xAC\xE5\xB8\x82\", \"offset\": 0}, {\"word\": \"\xE9\x95\xBF\xE6\xB1\x9F\", \"offset\": 9}, {\"word\": \"\xE5\xA4\xA7\xE6\xA1\xA5\", \"offset\": 15}]", result << words);

  jieba.CutHMM("我来自北京邮电大学。。。学号123456", words);
  result << words;
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\xE6\x9D\xA5\", \"offset\": 0}, {\"word\": \"\xE8\x87\xAA\xE5\x8C\x97\xE4\xBA\xAC\", \"offset\": 6}, {\"word\": \"\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 15}, {\"word\": \"\xE3\x80\x82\", \"offset\": 27}, {\"word\": \"\xE3\x80\x82\", \"offset\": 30}, {\"word\": \"\xE3\x80\x82\", \"offset\": 33}, {\"word\": \"\xE5\xAD\xA6\xE5\x8F\xB7\", \"offset\": 36}, {\"word\": \"123456\", \"offset\": 42}]", result);

  jieba.Cut("我来自北京邮电大学。。。学号123456，用AK47", words);
  result << words;
  //ASSERT_EQ("[\"我\", \"来自\", \"北京邮电大学\", \"。\", \"。\", \"。\", \"学号\", \"123456\", \"，\", \"用\", \"AK47\"]", result);
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE8\x87\xAA\", \"offset\": 3}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 9}, {\"word\": \"\xE3\x80\x82\", \"offset\": 27}, {\"word\": \"\xE3\x80\x82\", \"offset\": 30}, {\"word\": \"\xE3\x80\x82\", \"offset\": 33}, {\"word\": \"\xE5\xAD\xA6\xE5\x8F\xB7\", \"offset\": 36}, {\"word\": \"123456\", \"offset\": 42}, {\"word\": \"\xEF\xBC\x8C\", \"offset\": 48}, {\"word\": \"\xE7\x94\xA8\", \"offset\": 51}, {\"word\": \"AK47\", \"offset\": 54}]", result);

  jieba.CutAll("我来自北京邮电大学", words);
  result << words;
  //ASSERT_EQ(result, "[\"我\", \"来自\", \"北京\", \"北京邮电\", \"北京邮电大学\", \"邮电\", \"邮电大学\", \"电大\", \"大学\"]");
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE8\x87\xAA\", \"offset\": 3}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\", \"offset\": 9}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\", \"offset\": 9}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 9}, {\"word\": \"\xE9\x82\xAE\xE7\x94\xB5\", \"offset\": 15}, {\"word\": \"\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 15}, {\"word\": \"\xE7\x94\xB5\xE5\xA4\xA7\", \"offset\": 18}, {\"word\": \"\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 21}]", result);

  jieba.CutForSearch("他来到了网易杭研大厦", words);
  result << words;
  //ASSERT_EQ("[\"他\", \"来到\", \"了\", \"网易\", \"杭研\", \"大厦\"]", result);
  ASSERT_EQ("[{\"word\": \"\xE4\xBB\x96\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE5\x88\xB0\", \"offset\": 3}, {\"word\": \"\xE4\xBA\x86\", \"offset\": 9}, {\"word\": \"\xE7\xBD\x91\xE6\x98\x93\", \"offset\": 12}, {\"word\": \"\xE6\x9D\xAD\xE7\xA0\x94\", \"offset\": 18}, {\"word\": \"\xE5\xA4\xA7\xE5\x8E\xA6\", \"offset\": 24}]", result);
}